

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O1

string * __thiscall
helics::generateFullCoreInitString_abi_cxx11_
          (string *__return_storage_ptr__,helics *this,FederateInfo *fedInfo)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint __len;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)(this + 0xe0),
             *(long *)(this + 0xe8) + *(long *)(this + 0xe0));
  if (*(long *)(this + 0x128) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," --broker=");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,*(char **)(this + 0x120),*(size_type *)(this + 0x128));
  }
  if (-1 < *(int *)(this + 0x54)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," --brokerport=");
    uVar1 = *(uint *)(this + 0x54);
    __val = -uVar1;
    if (0 < (int)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar4 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar3 = (uint)uVar4;
        if (uVar3 < 100) {
          __len = __len - 2;
          goto LAB_0023e67d;
        }
        if (uVar3 < 1000) {
          __len = __len - 1;
          goto LAB_0023e67d;
        }
        if (uVar3 < 10000) goto LAB_0023e67d;
        uVar4 = uVar4 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar3);
      __len = __len + 1;
    }
LAB_0023e67d:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_50,(ulong)(__len + -((int)uVar1 >> 0x1f)),'-');
    CLI::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_50._M_dataplus._M_p + (uint)-((int)uVar1 >> 0x1f),__len,__val);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(this + 0x168) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," --localport=");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,*(char **)(this + 0x160),*(size_type *)(this + 0x168));
  }
  if (this[0x4d] == (helics)0x1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," --autobroker");
  }
  if (this[0x4e] == (helics)0x1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," --debugging");
  }
  if (this[0x4f] == (helics)0x1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," --observer");
  }
  if (this[0x59] == (helics)0x1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," --json");
  }
  if (this[0x5a] == (helics)0x1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," --encrypted");
  }
  if (*(long *)(this + 0x88) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," --encryption_config \"");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,*(char **)(this + 0x80),*(size_type *)(this + 0x88));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\"");
  }
  if (*(long *)(this + 0x68) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," --profiler \"");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,*(char **)(this + 0x60),*(size_type *)(this + 0x68));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\"");
  }
  if (*(long *)(this + 0x108) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," --broker_init_string \"");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,*(char **)(this + 0x100),*(size_type *)(this + 0x108));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\"");
  }
  if (*(long *)(this + 0x148) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," --broker_key=");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,*(char **)(this + 0x140),*(size_type *)(this + 0x148));
  }
  if (this[0x1a0] == (helics)0x1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," --config_section=core --config-file=\'");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,*(char **)(this + 0x180),*(size_type *)(this + 0x188));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'\'');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string generateFullCoreInitString(const FederateInfo& fedInfo)
{
    auto res = fedInfo.coreInitString;
    if (!fedInfo.broker.empty()) {
        res.append(" --broker=");
        res.append(fedInfo.broker);
    }
    if (fedInfo.brokerPort >= 0) {
        res.append(" --brokerport=");
        res.append(std::to_string(fedInfo.brokerPort));
    }
    if (!fedInfo.localport.empty()) {
        res.append(" --localport=");
        res.append(fedInfo.localport);
    }
    if (fedInfo.autobroker) {
        res.append(" --autobroker");
    }
    if (fedInfo.debugging) {
        res.append(" --debugging");
    }
    if (fedInfo.observer) {
        res.append(" --observer");
    }
    if (fedInfo.useJsonSerialization) {
        res.append(" --json");
    }
    if (fedInfo.encrypted) {
        res.append(" --encrypted");
    }
    if (!fedInfo.encryptionConfig.empty()) {
        res.append(" --encryption_config \"");
        res.append(fedInfo.encryptionConfig);
        res.append("\"");
    }
    if (!fedInfo.profilerFileName.empty()) {
        res.append(" --profiler \"");
        res.append(fedInfo.profilerFileName);
        res.append("\"");
    }
    if (!fedInfo.brokerInitString.empty()) {
        res.append(" --broker_init_string \"");
        res.append(fedInfo.brokerInitString);
        res.append("\"");
    }
    if (!fedInfo.key.empty()) {
        res += " --broker_key=";
        res.append(fedInfo.key);
    }
    if (fedInfo.fileInUse) {  // we used the file, specify a core section
        res += " --config_section=core --config-file='";
        res.append(fedInfo.configString);
        res.push_back('\'');
    }
    return res;
}